

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

uint __thiscall ON_SubDVertex::MaximumEdgeFaceCount(ON_SubDVertex *this)

{
  uint uVar1;
  unsigned_short vei;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar3 = 0;
  for (uVar2 = 0; this->m_edge_count != uVar2; uVar2 = uVar2 + 1) {
    uVar4 = this->m_edges[uVar2].m_ptr & 0xfffffffffffffff8;
    uVar1 = uVar3;
    if ((uVar4 != 0) && (uVar1 = *(uint *)(uVar4 + 100), (ushort)uVar1 <= (ushort)uVar3)) {
      uVar1 = uVar3;
    }
    uVar3 = uVar1;
  }
  return uVar3 & 0xffff;
}

Assistant:

unsigned int ON_SubDVertex::MaximumEdgeFaceCount() const
{
  unsigned short max_count = 0;
  for (unsigned short vei = 0; vei < m_edge_count; ++vei)
  {
    const ON_SubDEdge* e = ON_SUBD_EDGE_POINTER(m_edges[vei].m_ptr);
    if (nullptr != e && e->m_face_count > max_count)
    max_count = e->m_face_count;
  }
  return max_count;
}